

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O3

SudokuGitter * __thiscall
SudokuGitter::getSolvable(SudokuGitter *__return_storage_ptr__,SudokuGitter *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  undefined1 auVar4 [16];
  pointer __first;
  size_t __i;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint col;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2748;
  random_device local_2730;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  
  SudokuGitter(__return_storage_ptr__,this->elements);
  uVar9 = this->elements * this->elements;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_2748,(long)(int)uVar9,(allocator_type *)&local_13a8);
  if (0 < (int)uVar9) {
    dVar10 = ceil((double)(int)uVar9 * 0.3);
    auVar4 = _DAT_001090f0;
    lVar5 = (ulong)uVar9 - 1;
    auVar11._8_4_ = (int)lVar5;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar11 = auVar11 ^ _DAT_001090f0;
    auVar12 = _DAT_001090e0;
    do {
      auVar13 = auVar12 ^ auVar4;
      if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                  auVar11._4_4_ < auVar13._4_4_) & 1)) {
        local_2748.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (uint)((double)(int)uVar6 < dVar10);
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        local_2748.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6 + 1] = (uint)((double)((int)uVar6 + 1) < dVar10);
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar5 + 2;
    } while ((uVar9 + 1 & 0xfffffffe) != uVar6);
  }
  __first = local_2748.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_2730);
  uVar9 = std::random_device::_M_getval();
  local_13a8._M_x[0] = (unsigned_long)uVar9;
  lVar5 = 1;
  uVar6 = local_13a8._M_x[0];
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar5);
    local_13a8._M_x[lVar5] = uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_13a8._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_2748.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_13a8);
  std::random_device::_M_fini();
  uVar6 = (ulong)this->elements;
  if (uVar6 != 0) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      pvVar1 = (__return_storage_ptr__->cells).
               super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (this->cells).
               super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        if ((local_2748.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)((int)lVar5 + (int)uVar8)] == 1) &&
           (lVar3 = *(long *)&pvVar1[uVar7].super__Vector_base<cell,_std::allocator<cell>_>._M_impl,
           *(char *)(lVar3 + 4 + uVar8 * 8) == '\0')) {
          *(undefined4 *)(lVar3 + uVar8 * 8) =
               *(undefined4 *)
                (*(long *)&pvVar2[uVar7].super__Vector_base<cell,_std::allocator<cell>_>._M_impl +
                uVar8 * 8);
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + uVar6;
    } while (uVar7 != uVar6);
  }
  if (local_2748.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2748.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SudokuGitter SudokuGitter::getSolvable() {
    SudokuGitter solvable = SudokuGitter(getElements());

    int globalElements = getElements() * getElements();

    vector<unsigned int> permutation(globalElements);

    for (int i = 0; i < globalElements; i++) {
        if (i < ceil(globalElements * 0.30))
            permutation[i] = 1;
        else
            permutation[i] = 0;
    }

    shuffle(begin(permutation), end(permutation), std::mt19937(std::random_device()()));

    for (unsigned int row = 0; row < getElements(); row++) {
        for (unsigned int col = 0; col < getElements(); col++) {
            if (permutation[row * getElements() + col] == 1)
                solvable.setCell(row, col, getCellValue(row, col));
        }
    }

    return solvable;
}